

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_643cf::MkdirCommand::executeExternalCommand
          (MkdirCommand *this,BuildSystem *system,TaskInterface ti,QueueJobContext *context,
          Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *completionFn)

{
  BuildNode *pBVar1;
  long *plVar2;
  BuildSystemDelegate *pBVar3;
  TaskInterface ti_00;
  char cVar4;
  _Any_data *p_Var5;
  BuildSystemImpl *pBVar6;
  void *in_stack_ffffffffffffff48;
  undefined1 local_a8 [32];
  uint64_t local_88;
  StringRef local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  pBVar1 = *(this->super_ExternalCommand).super_Command.outputs.
            super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  plVar2 = *(long **)((long)system->impl + 0x10);
  local_70._M_dataplus._M_p = (pBVar1->super_Node).name._M_dataplus._M_p;
  local_70._M_string_length = (pBVar1->super_Node).name._M_string_length;
  llvm::StringRef::str_abi_cxx11_((string *)local_a8,(StringRef *)&local_70);
  cVar4 = (**(code **)(*plVar2 + 0x18))(plVar2,(string *)local_a8);
  std::__cxx11::string::_M_dispose();
  if (cVar4 == '\0') {
    ti_00.ctx = completionFn;
    ti_00.impl = in_stack_ffffffffffffff48;
    pBVar6 = getBuildSystem(ti_00);
    pBVar3 = pBVar6->delegate;
    local_80.Data = (pBVar1->super_Node).name._M_dataplus._M_p;
    local_80.Length = (pBVar1->super_Node).name._M_string_length;
    llvm::StringRef::str_abi_cxx11_(&local_50,&local_80);
    std::operator+(&local_70,"unable to create directory \'",&local_50);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                   &local_70,"\'");
    (*pBVar3->_vptr_BuildSystemDelegate[0xb])
              (pBVar3,this,local_a8._0_8_,CONCAT44(local_a8._12_4_,local_a8._8_4_));
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    if ((completionFn->Storage).hasVal != true) {
      return;
    }
    p_Var5 = (_Any_data *)
             llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::getPointer
                       (completionFn);
    local_a8._0_8_ = (pointer)0xffffffff00000001;
  }
  else {
    if ((completionFn->Storage).hasVal != true) {
      return;
    }
    p_Var5 = (_Any_data *)
             llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::getPointer
                       (completionFn);
    local_a8._0_8_ = (pointer)0xffffffff00000000;
  }
  local_a8._8_4_ = -1;
  local_88 = 0;
  local_a8._16_8_ = 0;
  local_a8._24_8_ = 0;
  if (*(long *)(p_Var5 + 1) != 0) {
    (**(code **)((long)p_Var5 + 0x18))(p_Var5,(ProcessResult *)local_a8);
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

virtual void executeExternalCommand(
      BuildSystem& system,
      TaskInterface ti,
      QueueJobContext* context,
      llvm::Optional<ProcessCompletionFn> completionFn) override {
    auto output = getOutputs()[0];
    if (!system.getFileSystem().createDirectories(
            output->getName())) {
      getBuildSystem(ti).getDelegate().commandHadError(this,
                     "unable to create directory '" + output->getName().str() + "'");
      if (completionFn.hasValue())
        completionFn.getValue()(ProcessStatus::Failed);
      return;
    }
    if (completionFn.hasValue())
      completionFn.getValue()(ProcessStatus::Succeeded);
  }